

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderCommonFunctionTests.cpp
# Opt level: O1

bool __thiscall
deqp::gles31::Functional::LdexpCase::compare(LdexpCase *this,void **inputs,void **outputs)

{
  float fVar1;
  float fVar2;
  Precision PVar3;
  pointer pSVar4;
  uint uVar5;
  ostream *poVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  float fVar10;
  uint uVar11;
  uint uVar12;
  float fVar13;
  float fVar14;
  uint uVar15;
  ostringstream *this_00;
  ulong uVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  deUint32 u32;
  deUint32 bBits;
  Hex<8UL> local_40;
  HexFloat local_34;
  
  pSVar4 = (this->super_CommonFunctionCase).m_spec.inputs.
           super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
           ._M_impl.super__Vector_impl_data._M_start;
  PVar3 = (pSVar4->varType).m_data.basic.precision;
  uVar5 = glu::getDataTypeScalarSize((pSVar4->varType).m_data.basic.type);
  bVar17 = (int)uVar5 < 1;
  if (0 < (int)uVar5) {
    fVar14 = (float)~(-1 << (0x17 - (&DAT_00986d1c)[(ulong)PVar3 * 4] & 0x1f));
    uVar16 = 0;
    do {
      fVar1 = *(float *)((long)*inputs + uVar16 * 4);
      iVar8 = *(int *)((long)inputs[1] + uVar16 * 4);
      if (fVar1 == 0.0 && iVar8 == 0) {
        fVar10 = (float)((uint)fVar1 & 0x80000000);
      }
      else {
        bVar18 = ((uint)fVar1 & 0x7f800000) != 0;
        uVar12 = (uint)fVar1 & 0x7fffff;
        bVar19 = uVar12 == 0;
        iVar7 = -0x7e;
        if (bVar19 || bVar18) {
          iVar7 = ((uint)fVar1 >> 0x17 & 0xff) - 0x7f;
        }
        iVar7 = iVar7 + iVar8;
        uVar11 = iVar7 * 0x800000 + 0x3f800000;
        uVar15 = uVar11;
        if (iVar7 == -0x7e) {
          uVar15 = 0;
        }
        uVar9 = uVar12 + 0x800000;
        if (fVar1 == 0.0 || !bVar19 && !bVar18) {
          uVar9 = uVar12;
        }
        if (fVar1 != 0.0 && (bVar19 || bVar18)) {
          uVar15 = uVar11;
        }
        if (uVar9 == 0 && iVar7 == 0) {
          uVar15 = 0;
        }
        fVar10 = (float)((uint)fVar1 & 0x807fffff | uVar15);
      }
      fVar2 = *(float *)((long)*outputs + uVar16 * 4);
      if (((fVar2 == 0.0) && (fVar13 = fVar10, !NAN(fVar2))) ||
         ((fVar10 == 0.0 && (fVar13 = fVar2, !NAN(fVar10))))) {
        fVar13 = ABS(fVar13);
      }
      else {
        fVar13 = (float)((int)fVar10 - (int)fVar2);
        if ((uint)fVar10 < (uint)fVar2) {
          fVar13 = (float)-((int)fVar10 - (int)fVar2);
        }
      }
      if ((uint)fVar14 < (uint)fVar13) {
        iVar7 = ((uint)fVar1 >> 0x17 & 0xff) - 0x7f;
        iVar8 = -0x7e;
        if (((uint)fVar1 & 0x7fffff) == 0) {
          iVar8 = iVar7;
        }
        if (((uint)fVar1 & 0x7f800000) != 0) {
          iVar8 = iVar7;
        }
        this_00 = &(this->super_CommonFunctionCase).m_failMsg;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"Expected [",10);
        poVar6 = (ostream *)std::ostream::operator<<(this_00,(int)uVar16);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"] = ",4);
        local_34.value = fVar10;
        poVar6 = Functional::operator<<(poVar6,&local_34);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,", (exp = ",9);
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,") with ULP threshold ",0x15);
        local_40.value = (deUint64)(uint)fVar14;
        poVar6 = tcu::Format::Hex<8UL>::toStream(&local_40,poVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,", got ULP diff ",0xf);
        local_40.value = (deUint64)(uint)fVar13;
        tcu::Format::Hex<8UL>::toStream(&local_40,poVar6);
        return bVar17;
      }
      uVar16 = uVar16 + 1;
      bVar17 = uVar5 <= uVar16;
    } while (uVar16 != uVar5);
  }
  return bVar17;
}

Assistant:

bool compare (const void* const* inputs, const void* const* outputs)
	{
		const glu::DataType		type			= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision		= m_spec.inputs[0].varType.getPrecision();
		const int				scalarSize		= glu::getDataTypeScalarSize(type);

		const int				mantissaBits	= getMinMantissaBits(precision);
		const deUint32			maxUlpDiff		= getMaxUlpDiffFromBits(mantissaBits);

		for (int compNdx = 0; compNdx < scalarSize; compNdx++)
		{
			const float		in0			= ((const float*)inputs[0])[compNdx];
			const int		in1			= ((const int*)inputs[1])[compNdx];
			const float		out0		= ((const float*)outputs[0])[compNdx];
			const float		refOut0		= ldexp(in0, in1);
			const deUint32	ulpDiff		= getUlpDiffIgnoreZeroSign(out0, refOut0);

			const int		inExp		= tcu::Float32(in0).exponent();

			if (ulpDiff > maxUlpDiff)
			{
				m_failMsg << "Expected [" << compNdx << "] = " << HexFloat(refOut0) << ", (exp = " << inExp << ") with ULP threshold "
						  << tcu::toHex(maxUlpDiff) << ", got ULP diff " << tcu::toHex(ulpDiff);
				return false;
			}
		}

		return true;
	}